

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O3

Abc_Obj_t * Abc_NodeFromFraig_rec(Abc_Ntk_t *pNtkNew,Fraig_Node_t *pNodeFraig)

{
  uint uVar1;
  Fraig_Node_t *pFVar2;
  Abc_Obj_t *p0;
  Abc_Obj_t *p1;
  Fraig_Node_t *pFVar3;
  Fraig_Node_t *pFVar4;
  Fraig_Node_t *pFVar5;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *paVar6;
  Fraig_Node_t *p;
  
  p = (Fraig_Node_t *)((ulong)pNodeFraig & 0xfffffffffffffffe);
  pFVar2 = Fraig_NodeReadData1(p);
  if (pFVar2 == (Fraig_Node_t *)0x0) {
    pFVar2 = Fraig_NodeReadOne(p);
    p0 = Abc_NodeFromFraig_rec(pNtkNew,pFVar2);
    pFVar2 = Fraig_NodeReadTwo(p);
    p1 = Abc_NodeFromFraig_rec(pNtkNew,pFVar2);
    pFVar2 = (Fraig_Node_t *)Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc,p0,p1);
    uVar1 = Fraig_NodeReadSimInv(p);
    pFVar2->TravId2 = pFVar2->TravId2 & 0xffffff7fU | (uVar1 & 1) << 7;
    pFVar3 = Fraig_NodeReadRepr(p);
    if ((pFVar3 == (Fraig_Node_t *)0x0) &&
       (pFVar3 = Fraig_NodeReadNextE(p), pFVar3 != (Fraig_Node_t *)0x0)) {
      pFVar4 = Fraig_NodeReadNextE(p);
      pFVar3 = pFVar2;
      if (pFVar4 == (Fraig_Node_t *)0x0) {
        paVar6 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)&pFVar2->pNextS;
      }
      else {
        do {
          pFVar5 = Fraig_NodeReadData1(pFVar4);
          if (pFVar5 != (Fraig_Node_t *)0x0) {
            __assert_fail("Fraig_NodeReadData1(pNodeTemp) == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFraig.c"
                          ,0x152,"Abc_Obj_t *Abc_NodeFromFraig_rec(Abc_Ntk_t *, Fraig_Node_t *)");
          }
          pFVar5 = (Fraig_Node_t *)Abc_NodeFromFraig_rec(pNtkNew,pFVar4);
          if ((uint)pFVar5->TravId2 >> 0xc < (uint)pFVar3->TravId2 >> 0xc) {
            pFVar3 = pFVar5;
          }
          pFVar4 = Fraig_NodeReadNextE(pFVar4);
        } while (pFVar4 != (Fraig_Node_t *)0x0);
        paVar6 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)&pFVar3->pNextS;
        if (pFVar2 != pFVar3) {
          paVar6->pData = pFVar2;
          paVar6 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)&pFVar2->pNextS;
        }
      }
      for (pFVar4 = Fraig_NodeReadNextE(p); pFVar4 != (Fraig_Node_t *)0x0;
          pFVar4 = Fraig_NodeReadNextE(pFVar4)) {
        pFVar5 = Fraig_NodeReadData1(pFVar4);
        if (pFVar5 == (Fraig_Node_t *)0x0) {
          __assert_fail("pResCur",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFraig.c"
                        ,0x161,"Abc_Obj_t *Abc_NodeFromFraig_rec(Abc_Ntk_t *, Fraig_Node_t *)");
        }
        if (pFVar3 != pFVar5) {
          paVar6->pData = pFVar5;
          paVar6 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)&pFVar5->pNextS;
        }
      }
      if (paVar6->pData != (void *)0x0) {
        __assert_fail("*ppTail == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFraig.c"
                      ,0x167,"Abc_Obj_t *Abc_NodeFromFraig_rec(Abc_Ntk_t *, Fraig_Node_t *)");
      }
      pFVar2 = (Fraig_Node_t *)
               ((ulong)((uint)(pFVar3->TravId2 ^ pFVar2->TravId2) >> 7 & 1) ^ (ulong)pFVar3);
    }
    Fraig_NodeSetData1(p,pFVar2);
  }
  return (Abc_Obj_t *)((ulong)((uint)pNodeFraig & 1) ^ (ulong)pFVar2);
}

Assistant:

Abc_Obj_t * Abc_NodeFromFraig_rec( Abc_Ntk_t * pNtkNew, Fraig_Node_t * pNodeFraig )
{
    Abc_Obj_t * pRes, * pRes0, * pRes1, * pResMin, * pResCur;
    Fraig_Node_t * pNodeTemp, * pNodeFraigR = Fraig_Regular(pNodeFraig);
    void ** ppTail;
    // check if the node was already considered
    if ( (pRes = (Abc_Obj_t *)Fraig_NodeReadData1(pNodeFraigR)) )
        return Abc_ObjNotCond( pRes, Fraig_IsComplement(pNodeFraig) );
    // solve the children
    pRes0 = Abc_NodeFromFraig_rec( pNtkNew, Fraig_NodeReadOne(pNodeFraigR) );
    pRes1 = Abc_NodeFromFraig_rec( pNtkNew, Fraig_NodeReadTwo(pNodeFraigR) );
    // derive the new node
    pRes = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, pRes0, pRes1 );
    pRes->fPhase = Fraig_NodeReadSimInv( pNodeFraigR );
    // if the node has an equivalence class, find its representative
    if ( Fraig_NodeReadRepr(pNodeFraigR) == NULL && Fraig_NodeReadNextE(pNodeFraigR) != NULL )
    {
        // go through the FRAIG nodes belonging to this equivalence class
        // and find the representative node (the node with the smallest level)
        pResMin = pRes;
        for ( pNodeTemp = Fraig_NodeReadNextE(pNodeFraigR); pNodeTemp; pNodeTemp = Fraig_NodeReadNextE(pNodeTemp) )
        {
            assert( Fraig_NodeReadData1(pNodeTemp) == NULL );
            pResCur = Abc_NodeFromFraig_rec( pNtkNew, pNodeTemp );
            if ( pResMin->Level > pResCur->Level )
                pResMin = pResCur;
        }
        // link the nodes in such a way that representative goes first
        ppTail = &pResMin->pData;
        if ( pRes != pResMin )
        {
            *ppTail = pRes;
            ppTail = &pRes->pData;
        }
        for ( pNodeTemp = Fraig_NodeReadNextE(pNodeFraigR); pNodeTemp; pNodeTemp = Fraig_NodeReadNextE(pNodeTemp) )
        {
            pResCur = (Abc_Obj_t *)Fraig_NodeReadData1(pNodeTemp);
            assert( pResCur );
            if ( pResMin == pResCur )
                continue;
            *ppTail = pResCur;
            ppTail = &pResCur->pData;
        }
        assert( *ppTail == NULL );

        // update the phase of the node
        pRes = Abc_ObjNotCond( pResMin, (pRes->fPhase ^ pResMin->fPhase) );
    }
    Fraig_NodeSetData1( pNodeFraigR, (Fraig_Node_t *)pRes );
    return Abc_ObjNotCond( pRes, Fraig_IsComplement(pNodeFraig) );
}